

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetDirectoryPropertyCommand.cxx
# Opt level: O3

bool __thiscall
cmGetDirectoryPropertyCommand::InitialPass
          (cmGetDirectoryPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  PolicyStatus PVar6;
  char *pcVar7;
  cmGlobalGenerator *this_00;
  cmLocalGenerator *pcVar8;
  PolicyID id;
  char *value;
  cmMakefile *pcVar9;
  pointer prop;
  string sd;
  string variable;
  string local_98;
  string local_78;
  cmMakefile *local_58;
  string local_50;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  pcVar3 = (pbVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + pbVar2->_M_string_length);
  prop = pbVar2 + 1;
  pcVar9 = (this->super_cmCommand).Makefile;
  iVar5 = std::__cxx11::string::compare((char *)prop);
  if (iVar5 == 0) {
    prop = pbVar2 + 2;
    if (prop == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"DIRECTORY argument provided without subsequent arguments","");
      cmCommand::SetError(&this->super_cmCommand,&local_98);
      goto LAB_0029a54d;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    pcVar3 = pbVar2[2]._M_dataplus._M_p;
    local_58 = pcVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar3,pcVar3 + pbVar2[2]._M_string_length);
    bVar4 = cmsys::SystemTools::FileIsFullPath(local_98._M_dataplus._M_p);
    if (!bVar4) {
      pcVar7 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      strlen(pcVar7);
      std::__cxx11::string::_M_replace
                ((ulong)&local_98,0,(char *)local_98._M_string_length,(ulong)pcVar7);
      std::__cxx11::string::append((char *)&local_98);
      std::__cxx11::string::_M_append((char *)&local_98,(ulong)pbVar2[2]._M_dataplus._M_p);
    }
    cmsys::SystemTools::CollapseFullPath(&local_50,&local_98);
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
    paVar1 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    pcVar8 = cmGlobalGenerator::FindLocalGenerator(this_00,&local_98);
    if (pcVar8 == (cmLocalGenerator *)0x0) {
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "DIRECTORY argument provided but requested directory not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                 ,"");
      cmCommand::SetError(&this->super_cmCommand,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_58 = pcVar8->Makefile;
      prop = pbVar2 + 3;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    pcVar9 = local_58;
    if (pcVar8 != (cmLocalGenerator *)0x0) goto LAB_0029a2cf;
  }
  else {
LAB_0029a2cf:
    iVar5 = std::__cxx11::string::compare((char *)prop);
    if (iVar5 != 0) {
      if (prop->_M_string_length == 0) {
        pcVar7 = (char *)0x0;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)prop);
        if (iVar5 == 0) {
          PVar6 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0059);
          if (PVar6 != OLD) {
            if (PVar6 != WARN) goto LAB_0029a308;
            pcVar9 = (this->super_cmCommand).Makefile;
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_98,(cmPolicies *)0x3b,id);
            cmMakefile::IssueMessage(pcVar9,AUTHOR_WARNING,&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
          }
          pcVar7 = cmMakefile::GetDefineFlagsCMP0059((this->super_cmCommand).Makefile);
        }
        else {
LAB_0029a308:
          pcVar7 = cmMakefile::GetProperty(pcVar9,prop);
        }
      }
      value = "";
      if (pcVar7 != (char *)0x0) {
        value = pcVar7;
      }
      bVar4 = true;
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_78,value);
      goto LAB_0029a5d4;
    }
    if (prop + 1 !=
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      pcVar7 = cmMakefile::GetSafeDefinition(pcVar9,prop + 1);
      std::__cxx11::string::string((string *)&local_98,pcVar7,(allocator *)&local_50);
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,&local_78,local_98._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      bVar4 = true;
      goto LAB_0029a5d4;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "A request for a variable definition was made without providing the name of the variable to get."
               ,"");
    cmCommand::SetError(&this->super_cmCommand,&local_98);
LAB_0029a54d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = false;
LAB_0029a5d4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool cmGetDirectoryPropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::vector<std::string>::const_iterator i = args.begin();
  std::string variable = *i;
  ++i;

  // get the directory argument if there is one
  cmMakefile *dir = this->Makefile;
  if (*i == "DIRECTORY")
    {
    ++i;
    if (i == args.end())
      {
      this->SetError
        ("DIRECTORY argument provided without subsequent arguments");
      return false;
      }
    std::string sd = *i;
    // make sure the start dir is a full path
    if (!cmSystemTools::FileIsFullPath(sd.c_str()))
      {
      sd = this->Makefile->GetCurrentSourceDirectory();
      sd += "/";
      sd += *i;
      }

    // The local generators are associated with collapsed paths.
    sd = cmSystemTools::CollapseFullPath(sd);

    // lookup the makefile from the directory name
    cmLocalGenerator *lg =
      this->Makefile->GetGlobalGenerator()->
      FindLocalGenerator(sd);
    if (!lg)
      {
      this->SetError
        ("DIRECTORY argument provided but requested directory not found. "
         "This could be because the directory argument was invalid or, "
         "it is valid but has not been processed yet.");
      return false;
      }
    dir = lg->GetMakefile();
    ++i;
    }

  // OK, now we have the directory to process, we just get the requested
  // information out of it

  if ( *i == "DEFINITION" )
    {
    ++i;
    if (i == args.end())
      {
      this->SetError("A request for a variable definition was made without "
                     "providing the name of the variable to get.");
      return false;
      }
    std::string output = dir->GetSafeDefinition(*i);
    this->Makefile->AddDefinition(variable, output.c_str());
    return true;
    }

  const char *prop = 0;
  if (!i->empty())
    {
    if (*i == "DEFINITIONS")
      {
      switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0059))
        {
        case cmPolicies::WARN:
          this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
                           cmPolicies::GetPolicyWarning(cmPolicies::CMP0059));
        case cmPolicies::OLD:
          this->StoreResult(variable,
                                   this->Makefile->GetDefineFlagsCMP0059());
        return true;
        case cmPolicies::NEW:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::REQUIRED_IF_USED:
          break;
        }
      }
    prop = dir->GetProperty(*i);
    }
  this->StoreResult(variable, prop);
  return true;
}